

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveMemoryInit.cpp
# Opt level: O2

void __thiscall wasm::RemoveMemoryInit::run(RemoveMemoryInit *this,Module *module)

{
  char *pcVar1;
  Name name;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(wasm::DataSegment_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveMemoryInit.cpp:29:32)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(wasm::DataSegment_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveMemoryInit.cpp:29:32)>
             ::_M_manager;
  Module::removeDataSegments(module,(function<bool_(wasm::DataSegment_*)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  pcVar1 = (module->start).super_IString.str._M_str;
  if (pcVar1 != (char *)0x0) {
    name.super_IString.str._M_str = pcVar1;
    name.super_IString.str._M_len = (module->start).super_IString.str._M_len;
    Module::removeFunction(module,name);
    (module->start).super_IString.str._M_len = 0;
    (module->start).super_IString.str._M_str = (char *)0x0;
  }
  return;
}

Assistant:

void run(Module* module) override {
    module->removeDataSegments([&](DataSegment* curr) { return true; });
    if (module->start) {
      module->removeFunction(module->start);
      module->start = Name();
    }
  }